

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argh.h
# Opt level: O1

void __thiscall argh::parser::parse(parser *this,int argc,char **argv,int mode)

{
  size_type sVar1;
  bool bVar2;
  long lVar3;
  const_iterator cVar4;
  ulong uVar5;
  ulong uVar6;
  pointer pbVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  size_type sVar10;
  string name;
  string keep_param;
  key_type local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  uint local_e4;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  _Base_ptr local_a0;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_98;
  _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
  *local_90;
  uint local_84;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_80;
  size_type local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_70;
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
  *local_60;
  key_type local_58;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *local_38;
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->args_,(long)argc);
  std::
  transform<char_const*const*,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,argh::parser::parse(int,char_const*const*,int)::_lambda(char_const*)_1_>
            (argv,argv + argc,
             (this->args_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start);
  pbVar7 = (this->args_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->args_).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != pbVar7) {
    local_38 = (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&this->pos_args_
    ;
    local_60 = (_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                *)&this->params_;
    local_98 = &this->registeredParams_;
    local_a0 = &(this->registeredParams_)._M_t._M_impl.super__Rb_tree_header._M_header;
    local_90 = (_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                *)&this->flags_;
    local_84 = mode & 3;
    uVar5 = 0;
    local_e4 = mode;
    do {
      bVar2 = is_option(this,pbVar7 + uVar5);
      if (bVar2) {
        pbVar7 = (this->args_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar5;
        lVar3 = std::__cxx11::string::find_first_not_of((char)pbVar7,0x2d);
        if (lVar3 == -1) {
          _Var9._M_p = (pbVar7->_M_dataplus)._M_p;
          local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_128,_Var9._M_p,_Var9._M_p + pbVar7->_M_string_length);
        }
        else {
          std::__cxx11::string::substr((ulong)&local_128,(ulong)pbVar7);
        }
        uVar6 = uVar5;
        if (((mode & 4U) == 0) &&
           (lVar3 = std::__cxx11::string::find((char)&local_128,0x3d), lVar3 != -1)) {
          std::__cxx11::string::substr((ulong)&local_108,(ulong)&local_128);
          std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_128);
          local_e0.first._M_dataplus._M_p = (pointer)&local_e0.first.field_2;
          local_e0.second._M_dataplus._M_p = (pointer)&local_e0.second.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p == &local_108.field_2) {
            local_e0.first.field_2._8_8_ = local_108.field_2._8_8_;
          }
          else {
            local_e0.first._M_dataplus._M_p = local_108._M_dataplus._M_p;
          }
          local_e0.first.field_2._M_local_buf[1] = local_108.field_2._M_local_buf[1];
          local_e0.first.field_2._M_local_buf[0] = local_108.field_2._M_local_buf[0];
          local_e0.first.field_2._M_allocated_capacity._2_6_ =
               local_108.field_2._M_allocated_capacity._2_6_;
          local_e0.first._M_string_length = local_108._M_string_length;
          local_108._M_string_length = 0;
          local_108.field_2._M_local_buf[0] = '\0';
          if (local_80 == &local_70) {
            local_e0.second.field_2._8_8_ = local_70._8_8_;
          }
          else {
            local_e0.second._M_dataplus._M_p = (pointer)local_80;
          }
          local_e0.second.field_2._M_allocated_capacity._1_7_ = local_70._M_allocated_capacity._1_7_
          ;
          local_e0.second.field_2._M_local_buf[0] = local_70._M_local_buf[0];
          local_e0.second._M_string_length = local_78;
          local_78 = 0;
          local_70._M_local_buf[0] = '\0';
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          local_80 = &local_70;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                    (local_60,&local_e0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
            operator_delete(local_e0.second._M_dataplus._M_p,
                            local_e0.second.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
            operator_delete(local_e0.first._M_dataplus._M_p,
                            local_e0.first.field_2._M_allocated_capacity + 1);
          }
          if (local_80 != &local_70) {
            operator_delete(local_80,CONCAT71(local_70._M_allocated_capacity._1_7_,
                                              local_70._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            uVar8 = CONCAT62(local_108.field_2._M_allocated_capacity._2_6_,
                             CONCAT11(local_108.field_2._M_local_buf[1],
                                      local_108.field_2._M_local_buf[0]));
            _Var9._M_p = local_108._M_dataplus._M_p;
LAB_001076b2:
            operator_delete(_Var9._M_p,uVar8 + 1);
          }
        }
        else {
          if (((mode & 8U) != 0) &&
             (((this->args_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar5]._M_string_length -
               local_128._M_string_length == 1 &&
              (cVar4 = std::
                       _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::find(&local_98->_M_t,&local_128), cVar4._M_node == local_a0)))) {
            local_e0.first._M_dataplus._M_p = (pointer)&local_e0.first.field_2;
            local_e0.first._M_string_length = 0;
            local_e0.first.field_2._M_allocated_capacity =
                 local_e0.first.field_2._M_allocated_capacity & 0xffffffffffffff00;
            if (local_128._M_string_length == 0) {
              bVar2 = false;
            }
            else {
              local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
              std::__cxx11::string::_M_construct((ulong)&local_58,'\x01');
              cVar4 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_98->_M_t,&local_58);
              bVar2 = cVar4._M_node != local_a0;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_58._M_dataplus._M_p != &local_58.field_2) {
                operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1
                               );
              }
            }
            if (bVar2) {
              std::__cxx11::string::push_back((char)&local_e0);
              std::__cxx11::string::resize((ulong)&local_128,(char)local_128._M_string_length + -1);
            }
            sVar1 = local_128._M_string_length;
            _Var9._M_p = local_128._M_dataplus._M_p;
            if (local_128._M_string_length != 0) {
              sVar10 = 0;
              do {
                local_108.field_2._M_local_buf[0] = _Var9._M_p[sVar10];
                local_108._M_string_length = 1;
                local_108.field_2._M_local_buf[1] = '\0';
                local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_emplace_equal<std::__cxx11::string>(local_90,&local_108);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_108._M_dataplus._M_p != &local_108.field_2) {
                  operator_delete(local_108._M_dataplus._M_p,
                                  CONCAT62(local_108.field_2._M_allocated_capacity._2_6_,
                                           CONCAT11(local_108.field_2._M_local_buf[1],
                                                    local_108.field_2._M_local_buf[0])) + 1);
                }
                sVar10 = sVar10 + 1;
              } while (sVar1 != sVar10);
            }
            if (local_e0.first._M_string_length == 0) {
              uVar8 = local_e0.first.field_2._M_allocated_capacity;
              _Var9._M_p = local_e0.first._M_dataplus._M_p;
              mode = local_e4;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) goto LAB_001076b2;
              goto LAB_001077fc;
            }
            std::__cxx11::string::_M_assign((string *)&local_128);
            mode = local_e4;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
              operator_delete(local_e0.first._M_dataplus._M_p,
                              local_e0.first.field_2._M_allocated_capacity + 1);
            }
          }
          pbVar7 = (this->args_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (((long)(this->args_).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5) - 1U != uVar5)
          {
            uVar6 = (ulong)((int)uVar5 + 1);
            bVar2 = is_option(this,pbVar7 + uVar6);
            if (!bVar2) {
              if (local_84 == 3) {
                __assert_fail("!(mode & argh::parser::PREFER_FLAG_FOR_UNREG_OPTION) || !(mode & argh::parser::PREFER_PARAM_FOR_UNREG_OPTION)"
                              ,
                              "/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/include/argh.h"
                              ,0xf6,"void argh::parser::parse(int, const char *const *, int)");
              }
              cVar4 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::find(&local_98->_M_t,&local_128);
              if (((mode & 2U) == 0) && (cVar4._M_node == local_a0)) {
                std::
                _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                ::_M_emplace_equal<std::__cxx11::string&>(local_90,&local_128);
                uVar6 = uVar5;
              }
              else {
                std::
                pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                ::
                pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                          (&local_e0,&local_128,
                           (this->args_).
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar6);
                std::
                _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                ::_M_insert_unique<std::pair<std::__cxx11::string_const,std::__cxx11::string>>
                          (local_60,&local_e0);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0.second._M_dataplus._M_p != &local_e0.second.field_2) {
                  operator_delete(local_e0.second._M_dataplus._M_p,
                                  local_e0.second.field_2._M_allocated_capacity + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e0.first._M_dataplus._M_p != &local_e0.first.field_2) {
                  operator_delete(local_e0.first._M_dataplus._M_p,
                                  local_e0.first.field_2._M_allocated_capacity + 1);
                }
              }
              goto LAB_001077fc;
            }
          }
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_emplace_equal<std::__cxx11::string&>(local_90,&local_128);
          uVar6 = uVar5;
        }
LAB_001077fc:
        uVar5 = uVar6;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_128._M_dataplus._M_p != &local_128.field_2) {
          operator_delete(local_128._M_dataplus._M_p,local_128.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string&>
                  (local_38,(this->args_).
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start + uVar5);
      }
      uVar5 = (ulong)((int)uVar5 + 1);
      pbVar7 = (this->args_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (uVar5 < (ulong)((long)(this->args_).
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar7 >> 5));
  }
  return;
}

Assistant:

inline void parser::parse(int argc, const char* const argv[], int mode /*= PREFER_FLAG_FOR_UNREG_OPTION*/)
	{
		// convert to strings
		args_.resize(static_cast<decltype(args_)::size_type>(argc));
		std::transform(argv, argv + argc, args_.begin(), [](const char* const arg) { return arg;  });

		// parse line
		for (auto i = 0u; i < args_.size(); ++i)
		{
			if (!is_option(args_[i]))
			{
				pos_args_.emplace_back(args_[i]);
				continue;
			}

			auto name = trim_leading_dashes(args_[i]);

			if (!(mode & NO_SPLIT_ON_EQUALSIGN))
			{
				auto equalPos = name.find('=');
				if (equalPos != std::string::npos)
				{
					params_.insert({ name.substr(0, equalPos), name.substr(equalPos + 1) });
					continue;
				}
			}

			// if the option is unregistered and should be a multi-flag
			if (1 == (args_[i].size() - name.size()) &&         // single dash
				argh::parser::SINGLE_DASH_IS_MULTIFLAG & mode && // multi-flag mode
				!is_param(name))                                  // unregistered
			{
				std::string keep_param;

				if (!name.empty() && is_param(std::string(1ul, name.back()))) // last char is param
				{
					keep_param += name.back();
					name.resize(name.size() - 1);
				}

				for (auto const& c : name)
				{
					flags_.emplace(std::string{ c });
				}

				if (!keep_param.empty())
				{
					name = keep_param;
				}
				else
				{
					continue; // do not consider other options for this arg
				}
			}

			// any potential option will get as its value the next arg, unless that arg is an option too
			// in that case it will be determined a flag.
			if (i == args_.size() - 1 || is_option(args_[i + 1]))
			{
				flags_.emplace(name);
				continue;
			}

			// if 'name' is a pre-registered option, then the next arg cannot be a free parameter to it is skipped
			// otherwise we have 2 modes:
			// PREFER_FLAG_FOR_UNREG_OPTION: a non-registered 'name' is determined a flag.
			//                               The following value (the next arg) will be a free parameter.
			//
			// PREFER_PARAM_FOR_UNREG_OPTION: a non-registered 'name' is determined a parameter, the next arg
			//                                will be the value of that option.

			assert(!(mode & argh::parser::PREFER_FLAG_FOR_UNREG_OPTION)
				   || !(mode & argh::parser::PREFER_PARAM_FOR_UNREG_OPTION));

			bool preferParam = mode & argh::parser::PREFER_PARAM_FOR_UNREG_OPTION;

			if (is_param(name) || preferParam)
			{
				params_.insert({ name, args_[i + 1] });
				++i; // skip next value, it is not a free parameter
				continue;
			}
			else
			{
				flags_.emplace(name);
			}
		};
	}